

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::SetHasOnlyWritableDataProperties(DynamicTypeHandler *this,bool value)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  bVar3 = GetHasOnlyWritableDataProperties(this);
  uVar1._0_1_ = this->propertyTypes;
  uVar1._1_1_ = this->flags;
  uVar1._2_2_ = this->offsetOfInlineSlots;
  uVar5 = (uint)((undefined1)uVar1 ^ 0x10);
  if (bVar3 == value) {
    uVar5 = uVar1;
  }
  this->propertyTypes = (byte)uVar5 | 0x20;
  if ((uVar5 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x1a1,"((propertyTypes & 0x01) != 0)",
                                "(propertyTypes & PropertyTypesReserved) != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void SetHasOnlyWritableDataProperties(bool value)
        {
            if (value != GetHasOnlyWritableDataProperties())
            {
                propertyTypes ^= PropertyTypesWritableDataOnly;
            }

            // Turn on the detection bit.
            propertyTypes |= PropertyTypesWritableDataOnlyDetection;
            Assert((propertyTypes & PropertyTypesReserved) != 0);
        }